

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void_(cppcms::http::context::completion_type)>::callback<unit_test::binder>
          (callback<void_(cppcms::http::context::completion_type)> *this,binder *func)

{
  callable_impl<void,_unit_test::binder> *this_00;
  binder bStack_38;
  
  this_00 = (callable_impl<void,_unit_test::binder> *)operator_new(0x28);
  unit_test::binder::binder(&bStack_38,func);
  callable_impl<void,_unit_test::binder>::callable_impl(this_00,&bStack_38);
  (this->call_ptr).p_ = (callable<void_(cppcms::http::context::completion_type)> *)this_00;
  booster::atomic_counter::inc();
  intrusive_ptr<unit_test>::~intrusive_ptr(&bStack_38.self);
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}